

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  Parse *pParse;
  uint uVar4;
  Walker w;
  Walker local_48;
  
  if (pExpr != (Expr *)0x0) {
    pParse = pNC->pParse;
    if (pParse->db->aLimit[3] < pParse->nHeight + pExpr->nHeight) {
      sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
      uVar4 = 1;
    }
    else {
      pParse->nHeight = pParse->nHeight + pExpr->nHeight;
      uVar2 = pNC->ncFlags;
      pNC->ncFlags = uVar2 & 0xefef;
      local_48.pParse = pNC->pParse;
      local_48.xExprCallback = resolveExprStep;
      local_48.xSelectCallback = resolveSelectStep;
      local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_48.walkerDepth = 0;
      local_48.eCode = '\0';
      local_48.u.pNC = pNC;
      walkExpr(&local_48,pExpr);
      piVar1 = &pNC->pParse->nHeight;
      *piVar1 = *piVar1 - pExpr->nHeight;
      if ((0 < pNC->nErr) || (0 < (local_48.pParse)->nErr)) {
        *(byte *)&pExpr->flags = (byte)pExpr->flags | 8;
      }
      uVar3 = pNC->ncFlags;
      if ((uVar3 & 0x10) != 0) {
        *(byte *)&pExpr->flags = (byte)pExpr->flags | 2;
      }
      pNC->ncFlags = uVar2 & 0x1010 | uVar3;
      uVar4 = pExpr->flags >> 3 & 1;
    }
    return uVar4;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames( 
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  u16 savedHasAgg;
  Walker w;

  if( pExpr==0 ) return 0;
#if SQLITE_MAX_EXPR_DEPTH>0
  {
    Parse *pParse = pNC->pParse;
    if( sqlite3ExprCheckHeight(pParse, pExpr->nHeight+pNC->pParse->nHeight) ){
      return 1;
    }
    pParse->nHeight += pExpr->nHeight;
  }
#endif
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.walkerDepth = 0;
  w.eCode = 0;
  w.u.pNC = pNC;
  sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  pNC->pParse->nHeight -= pExpr->nHeight;
#endif
  if( pNC->nErr>0 || w.pParse->nErr>0 ){
    ExprSetProperty(pExpr, EP_Error);
  }
  if( pNC->ncFlags & NC_HasAgg ){
    ExprSetProperty(pExpr, EP_Agg);
  }
  pNC->ncFlags |= savedHasAgg;
  return ExprHasProperty(pExpr, EP_Error);
}